

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Padding_x86::forward(Padding_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint _c;
  int iVar5;
  _func_int *p_Var6;
  _func_int **pp_Var7;
  int *piVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined1 uVar20;
  undefined4 uVar21;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined1 uVar26;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined1 uVar32;
  undefined1 uVar34;
  int iVar35;
  uint uVar36;
  uint uVar37;
  int iVar38;
  ulong uVar39;
  ulong uVar40;
  int unaff_EBP;
  int iVar41;
  float *outptr;
  undefined4 *puVar42;
  ulong uVar43;
  size_t sVar44;
  undefined8 *puVar45;
  undefined8 *puVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  undefined4 *puVar51;
  size_t sVar52;
  ulong uVar53;
  int iVar54;
  undefined8 *puVar55;
  undefined4 *puVar56;
  long lVar57;
  ulong uVar58;
  bool bVar59;
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  __m128 v;
  __m128 v_00;
  __m128 v_01;
  __m128 v_02;
  Mat m;
  Mat m_1;
  undefined4 uVar15;
  undefined3 uVar17;
  undefined2 uVar19;
  undefined4 uVar23;
  undefined3 uVar25;
  undefined2 uVar27;
  undefined3 uVar31;
  undefined2 uVar33;
  
  p_Var6 = this->_vptr_Padding_x86[-3];
  if (((((*(int *)(&this->field_0xd0 + (long)p_Var6) == 0) &&
        (*(int *)(&this->field_0xd4 + (long)p_Var6) == 0)) &&
       (*(int *)(&this->field_0xd8 + (long)p_Var6) == 0)) &&
      ((*(int *)(&this->field_0xdc + (long)p_Var6) == 0 &&
       (*(int *)(&this->field_0xe8 + (long)p_Var6) == 0)))) &&
     (*(int *)(&this->field_0xec + (long)p_Var6) == 0)) {
    iVar35 = 0;
    if (top_blob != bottom_blob) {
      piVar8 = bottom_blob->refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      piVar8 = top_blob->refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar8 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar8;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar2 = bottom_blob->w;
      iVar3 = bottom_blob->h;
      iVar4 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar2;
      top_blob->h = iVar3;
      top_blob->d = iVar4;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
    }
  }
  else {
    iVar35 = bottom_blob->elempack;
    if ((iVar35 != 0) && (((int)bottom_blob->elemsize << 3) / iVar35 == 8)) {
      iVar35 = forward_int8(this,bottom_blob,top_blob,opt);
      return iVar35;
    }
    if (iVar35 == 4) {
      iVar2 = bottom_blob->w;
      iVar3 = bottom_blob->h;
      iVar4 = bottom_blob->d;
      _c = bottom_blob->c;
      iVar5 = bottom_blob->dims;
      uVar43 = bottom_blob->elemsize;
      if (iVar5 == 1) {
        uVar36 = *(uint *)(&this->field_0xd8 + (long)p_Var6) + iVar2 * 4 +
                 *(int *)(&this->field_0xdc + (long)p_Var6);
        bVar59 = (uVar36 & 3) == 0;
        bVar9 = true;
        if (((*(uint *)(&this->field_0xd8 + (long)p_Var6) & 3) == 0 && bVar59) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0)) {
          iVar38 = (uint)bVar59 * 3 + 1;
          Mat::create(top_blob,(int)uVar36 / iVar38,(uVar43 >> 2) << bVar59 * '\x02',iVar38,
                      opt->blob_allocator);
          unaff_EBP = -100;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            p_Var6 = this->_vptr_Padding_x86[-3];
            iVar38 = *(int *)(&this->field_0xd8 + (long)p_Var6);
            iVar49 = *(int *)(&this->field_0xdc + (long)p_Var6);
            iVar47 = iVar38 + 3;
            if (-1 < iVar38) {
              iVar47 = iVar38;
            }
            iVar38 = iVar49 + 3;
            if (-1 < iVar49) {
              iVar38 = iVar49;
            }
            v[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var6);
            v[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var6);
            v[3] = (float)in_XMM1_Db;
            v[2] = (float)in_XMM1_Da;
            padding_constant_pack4_sse(bottom_blob,top_blob,0,0,iVar47 >> 2,iVar38 >> 2,v);
            unaff_EBP = 0;
          }
          bVar9 = false;
        }
        if (!bVar9) {
          return unaff_EBP;
        }
      }
      if (iVar5 == 2) {
        p_Var6 = this->_vptr_Padding_x86[-3];
        uVar36 = *(uint *)(&this->field_0xd0 + (long)p_Var6) + iVar3 * 4 +
                 *(int *)(&this->field_0xd4 + (long)p_Var6);
        bVar59 = (uVar36 & 3) == 0;
        bVar9 = true;
        if (((*(uint *)(&this->field_0xd0 + (long)p_Var6) & 3) == 0 && bVar59) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0)) {
          iVar38 = (uint)bVar59 * 3 + 1;
          Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var6) + iVar2 +
                               *(int *)(&this->field_0xdc + (long)p_Var6),(int)uVar36 / iVar38,
                      (uVar43 >> 2) << bVar59 * '\x02',iVar38,opt->blob_allocator);
          unaff_EBP = -100;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            p_Var6 = this->_vptr_Padding_x86[-3];
            iVar38 = *(int *)(&this->field_0xd0 + (long)p_Var6);
            iVar49 = *(int *)(&this->field_0xd4 + (long)p_Var6);
            iVar47 = iVar38 + 3;
            if (-1 < iVar38) {
              iVar47 = iVar38;
            }
            iVar38 = iVar49 + 3;
            if (-1 < iVar49) {
              iVar38 = iVar49;
            }
            v_00[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var6);
            v_00[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var6);
            v_00[3] = (float)in_XMM1_Db;
            v_00[2] = (float)in_XMM1_Da;
            padding_constant_pack4_sse
                      (bottom_blob,top_blob,iVar47 >> 2,iVar38 >> 2,
                       *(int *)(&this->field_0xd8 + (long)p_Var6),
                       *(int *)(&this->field_0xdc + (long)p_Var6),v_00);
            unaff_EBP = 0;
          }
          bVar9 = false;
        }
        if (!bVar9) {
          return unaff_EBP;
        }
      }
      if (iVar5 == 3) {
        p_Var6 = this->_vptr_Padding_x86[-3];
        uVar36 = *(uint *)(&this->field_0xe8 + (long)p_Var6) + _c * 4 +
                 *(int *)(&this->field_0xec + (long)p_Var6);
        bVar59 = (uVar36 & 3) == 0;
        bVar9 = true;
        if ((*(uint *)(&this->field_0xe8 + (long)p_Var6) & 3) == 0 && bVar59) {
          if ((uVar36 == _c * 4) || (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0)) {
            iVar49 = (uint)bVar59 * 3 + 1;
            uVar58 = (long)(int)uVar36 / (long)iVar49;
            iVar38 = (int)uVar58;
            Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var6) + iVar2 +
                                 *(int *)(&this->field_0xdc + (long)p_Var6),
                        *(int *)(&this->field_0xd0 + (long)p_Var6) + iVar3 +
                        *(int *)(&this->field_0xd4 + (long)p_Var6),iVar38,
                        (uVar43 >> 2) << bVar59 * '\x02',iVar49,opt->blob_allocator);
            unaff_EBP = -100;
            if (top_blob->data == (void *)0x0) {
              bVar9 = false;
            }
            else {
              bVar9 = false;
              if ((long)top_blob->c * top_blob->cstep != 0) {
                iVar49 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86[-3]);
                iVar47 = iVar49 + 3;
                if (-1 < iVar49) {
                  iVar47 = iVar49;
                }
                if (0 < iVar38) {
                  uVar53 = 0;
                  do {
                    m.h = top_blob->h;
                    m.c = top_blob->d;
                    uVar39 = top_blob->elemsize;
                    puVar42 = (undefined4 *)
                              (top_blob->cstep * uVar53 * uVar39 + (long)top_blob->data);
                    m.elempack = top_blob->elempack;
                    m.allocator = top_blob->allocator;
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = (undefined4)uVar39;
                    m.elemsize._4_4_ = (undefined4)(uVar39 >> 0x20);
                    m.d = 1;
                    sVar44 = (long)m.h * (long)top_blob->w;
                    m.w = top_blob->w;
                    m.dims = top_blob->dims + -1;
                    m.cstep = (uVar39 * sVar44 + 0xf & 0xfffffffffffffff0) / uVar39;
                    if (top_blob->dims == 4) {
                      m.cstep = sVar44;
                    }
                    p_Var6 = this->_vptr_Padding_x86[-3];
                    if (*(int *)(&this->field_0xf0 + (long)p_Var6) == 0) {
                      uVar60 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var6);
                      uVar61 = uVar60;
                      uVar62 = uVar60;
                      uVar63 = uVar60;
                    }
                    else {
                      puVar56 = (undefined4 *)
                                (*(long *)(&this->field_0xf8 + (long)p_Var6) + uVar53 * 0x10);
                      uVar60 = *puVar56;
                      uVar61 = puVar56[1];
                      uVar62 = puVar56[2];
                      uVar63 = puVar56[3];
                    }
                    uVar36 = (int)uVar53 - (iVar47 >> 2);
                    m.data = puVar42;
                    if ((int)uVar36 < 0 || (int)_c <= (int)uVar36) {
                      iVar38 = m.c * (int)m.cstep;
                      if (0 < iVar38) {
                        do {
                          *puVar42 = uVar60;
                          puVar42[1] = uVar61;
                          puVar42[2] = uVar62;
                          puVar42[3] = uVar63;
                          puVar42 = puVar42 + 4;
                          iVar38 = iVar38 + -1;
                        } while (iVar38 != 0);
                      }
                    }
                    else {
                      m_1.w = bottom_blob->w;
                      m_1.h = bottom_blob->h;
                      m_1.c = bottom_blob->d;
                      uVar39 = bottom_blob->elemsize;
                      puVar56 = (undefined4 *)
                                ((ulong)uVar36 * bottom_blob->cstep * uVar39 +
                                (long)bottom_blob->data);
                      m_1.elempack = bottom_blob->elempack;
                      m_1.allocator = bottom_blob->allocator;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = (undefined4)uVar39;
                      m_1.elemsize._4_4_ = (undefined4)(uVar39 >> 0x20);
                      m_1.d = 1;
                      m_1.dims = bottom_blob->dims + -1;
                      m_1.cstep = (uVar39 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) /
                                  uVar39;
                      if (bottom_blob->dims == 4) {
                        m_1.cstep = (long)m_1.h * (long)m_1.w;
                      }
                      p_Var6 = this->_vptr_Padding_x86[-3];
                      m_1.data = puVar56;
                      if (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0) {
                        v_01[1] = (float)uVar61;
                        v_01[0] = (float)uVar60;
                        v_01[2] = 0.0;
                        v_01[3] = 0.0;
                        padding_constant_pack4_sse
                                  (&m_1,&m,*(int *)(&this->field_0xd0 + (long)p_Var6),
                                   *(int *)(&this->field_0xd4 + (long)p_Var6),
                                   *(int *)(&this->field_0xd8 + (long)p_Var6),
                                   *(int *)(&this->field_0xdc + (long)p_Var6),v_01);
                      }
                      pp_Var7 = this->_vptr_Padding_x86;
                      p_Var6 = pp_Var7[-3];
                      if (*(int *)(&this->field_0xe0 + (long)p_Var6) == 1) {
                        iVar38 = *(int *)(&this->field_0xd0 + (long)p_Var6);
                        iVar49 = *(int *)(&this->field_0xd4 + (long)p_Var6);
                        iVar54 = *(int *)(&this->field_0xd8 + (long)p_Var6);
                        iVar41 = *(int *)(&this->field_0xdc + (long)p_Var6);
                        if (0 < iVar38) {
                          iVar48 = 0;
                          do {
                            uVar60 = *puVar56;
                            uVar61 = puVar56[1];
                            uVar62 = puVar56[2];
                            uVar63 = puVar56[3];
                            iVar50 = iVar54;
                            if (0 < iVar54) {
                              do {
                                *puVar42 = uVar60;
                                puVar42[1] = uVar61;
                                puVar42[2] = uVar62;
                                puVar42[3] = uVar63;
                                puVar42 = puVar42 + 4;
                                iVar50 = iVar50 + -1;
                              } while (iVar50 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar50 = 0;
                              puVar51 = puVar56;
                              do {
                                uVar60 = *puVar51;
                                uVar61 = puVar51[1];
                                uVar62 = puVar51[2];
                                uVar63 = puVar51[3];
                                *puVar42 = uVar60;
                                puVar42[1] = uVar61;
                                puVar42[2] = uVar62;
                                puVar42[3] = uVar63;
                                puVar51 = puVar51 + 4;
                                puVar42 = puVar42 + 4;
                                iVar50 = iVar50 + 1;
                              } while (iVar50 < m_1.w);
                            }
                            iVar50 = iVar41;
                            if (0 < iVar41) {
                              do {
                                *puVar42 = uVar60;
                                puVar42[1] = uVar61;
                                puVar42[2] = uVar62;
                                puVar42[3] = uVar63;
                                puVar42 = puVar42 + 4;
                                iVar50 = iVar50 + -1;
                              } while (iVar50 != 0);
                            }
                            iVar48 = iVar48 + 1;
                          } while (iVar48 != iVar38);
                        }
                        if (0 < m_1.h) {
                          iVar38 = 0;
                          do {
                            uVar60 = *puVar56;
                            uVar61 = puVar56[1];
                            uVar62 = puVar56[2];
                            uVar63 = puVar56[3];
                            iVar48 = iVar54;
                            if (0 < iVar54) {
                              do {
                                *puVar42 = uVar60;
                                puVar42[1] = uVar61;
                                puVar42[2] = uVar62;
                                puVar42[3] = uVar63;
                                puVar42 = puVar42 + 4;
                                iVar48 = iVar48 + -1;
                              } while (iVar48 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar48 = 0;
                              do {
                                uVar60 = *puVar56;
                                uVar61 = puVar56[1];
                                uVar62 = puVar56[2];
                                uVar63 = puVar56[3];
                                *puVar42 = uVar60;
                                puVar42[1] = uVar61;
                                puVar42[2] = uVar62;
                                puVar42[3] = uVar63;
                                puVar56 = puVar56 + 4;
                                puVar42 = puVar42 + 4;
                                iVar48 = iVar48 + 1;
                              } while (iVar48 < m_1.w);
                            }
                            iVar48 = iVar41;
                            if (0 < iVar41) {
                              do {
                                *puVar42 = uVar60;
                                puVar42[1] = uVar61;
                                puVar42[2] = uVar62;
                                puVar42[3] = uVar63;
                                puVar42 = puVar42 + 4;
                                iVar48 = iVar48 + -1;
                              } while (iVar48 != 0);
                            }
                            iVar38 = iVar38 + 1;
                          } while (iVar38 < m_1.h);
                        }
                        if (0 < iVar49) {
                          puVar56 = puVar56 + (long)m_1.w * -4;
                          iVar38 = 0;
                          do {
                            uVar60 = *puVar56;
                            uVar61 = puVar56[1];
                            uVar62 = puVar56[2];
                            uVar63 = puVar56[3];
                            iVar48 = iVar54;
                            if (0 < iVar54) {
                              do {
                                *puVar42 = uVar60;
                                puVar42[1] = uVar61;
                                puVar42[2] = uVar62;
                                puVar42[3] = uVar63;
                                puVar42 = puVar42 + 4;
                                iVar48 = iVar48 + -1;
                              } while (iVar48 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar48 = 0;
                              puVar51 = puVar56;
                              do {
                                uVar60 = *puVar51;
                                uVar61 = puVar51[1];
                                uVar62 = puVar51[2];
                                uVar63 = puVar51[3];
                                *puVar42 = uVar60;
                                puVar42[1] = uVar61;
                                puVar42[2] = uVar62;
                                puVar42[3] = uVar63;
                                puVar51 = puVar51 + 4;
                                puVar42 = puVar42 + 4;
                                iVar48 = iVar48 + 1;
                              } while (iVar48 < m_1.w);
                            }
                            iVar48 = iVar41;
                            if (0 < iVar41) {
                              do {
                                *puVar42 = uVar60;
                                puVar42[1] = uVar61;
                                puVar42[2] = uVar62;
                                puVar42[3] = uVar63;
                                puVar42 = puVar42 + 4;
                                iVar48 = iVar48 + -1;
                              } while (iVar48 != 0);
                            }
                            iVar38 = iVar38 + 1;
                          } while (iVar38 != iVar49);
                        }
                      }
                      p_Var6 = pp_Var7[-3];
                      if (*(int *)(&this->field_0xe0 + (long)p_Var6) == 2) {
                        iVar38 = *(int *)(&this->field_0xd0 + (long)p_Var6);
                        iVar49 = *(int *)(&this->field_0xd4 + (long)p_Var6);
                        uVar36 = *(uint *)(&this->field_0xd8 + (long)p_Var6);
                        uVar39 = (ulong)uVar36;
                        uVar37 = *(uint *)(&this->field_0xdc + (long)p_Var6);
                        uVar40 = (ulong)uVar37;
                        puVar46 = (undefined8 *)((long)(m_1.w * iVar38 * 4) * 4 + (long)m_1.data);
                        puVar45 = (undefined8 *)m.data;
                        if (0 < iVar38) {
                          iVar54 = 0;
                          do {
                            lVar57 = uVar39 << 4;
                            if (0 < (int)uVar36) {
                              do {
                                uVar10 = ((undefined8 *)((long)puVar46 + lVar57))[1];
                                *puVar45 = *(undefined8 *)((long)puVar46 + lVar57);
                                puVar45[1] = uVar10;
                                puVar45 = puVar45 + 2;
                                lVar57 = lVar57 + -0x10;
                              } while (lVar57 != 0);
                            }
                            puVar55 = puVar46;
                            if (0 < m_1.w) {
                              iVar41 = 0;
                              do {
                                uVar10 = puVar55[1];
                                *puVar45 = *puVar55;
                                puVar45[1] = uVar10;
                                puVar55 = puVar55 + 2;
                                puVar45 = puVar45 + 2;
                                iVar41 = iVar41 + 1;
                              } while (iVar41 < m_1.w);
                            }
                            if (0 < (int)uVar37) {
                              lVar57 = -0x20;
                              do {
                                uVar10 = ((undefined8 *)((long)puVar55 + lVar57))[1];
                                *puVar45 = *(undefined8 *)((long)puVar55 + lVar57);
                                puVar45[1] = uVar10;
                                puVar45 = puVar45 + 2;
                                lVar1 = uVar40 * 0x10 + lVar57;
                                lVar57 = lVar57 + -0x10;
                              } while (lVar1 != -0x10);
                            }
                            puVar46 = puVar46 + (long)m_1.w * -2;
                            iVar54 = iVar54 + 1;
                          } while (iVar54 != iVar38);
                        }
                        if (0 < m_1.h) {
                          iVar38 = 0;
                          do {
                            lVar57 = uVar39 << 4;
                            if (0 < (int)uVar36) {
                              do {
                                uVar10 = ((undefined8 *)((long)puVar46 + lVar57))[1];
                                *puVar45 = *(undefined8 *)((long)puVar46 + lVar57);
                                puVar45[1] = uVar10;
                                puVar45 = puVar45 + 2;
                                lVar57 = lVar57 + -0x10;
                              } while (lVar57 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar54 = 0;
                              do {
                                uVar10 = puVar46[1];
                                *puVar45 = *puVar46;
                                puVar45[1] = uVar10;
                                puVar46 = puVar46 + 2;
                                puVar45 = puVar45 + 2;
                                iVar54 = iVar54 + 1;
                              } while (iVar54 < m_1.w);
                            }
                            if (0 < (int)uVar37) {
                              lVar57 = -0x20;
                              do {
                                uVar10 = ((undefined8 *)((long)puVar46 + lVar57))[1];
                                *puVar45 = *(undefined8 *)((long)puVar46 + lVar57);
                                puVar45[1] = uVar10;
                                puVar45 = puVar45 + 2;
                                lVar1 = uVar40 * 0x10 + lVar57;
                                lVar57 = lVar57 + -0x10;
                              } while (lVar1 != -0x10);
                            }
                            iVar38 = iVar38 + 1;
                          } while (iVar38 < m_1.h);
                        }
                        if (0 < iVar49) {
                          puVar46 = puVar46 + (long)m_1.w * -4;
                          iVar38 = 0;
                          do {
                            lVar57 = uVar39 << 4;
                            if (0 < (int)uVar36) {
                              do {
                                uVar10 = ((undefined8 *)((long)puVar46 + lVar57))[1];
                                *puVar45 = *(undefined8 *)((long)puVar46 + lVar57);
                                puVar45[1] = uVar10;
                                puVar45 = puVar45 + 2;
                                lVar57 = lVar57 + -0x10;
                              } while (lVar57 != 0);
                            }
                            puVar55 = puVar46;
                            if (0 < m_1.w) {
                              iVar54 = 0;
                              do {
                                uVar10 = puVar55[1];
                                *puVar45 = *puVar55;
                                puVar45[1] = uVar10;
                                puVar55 = puVar55 + 2;
                                puVar45 = puVar45 + 2;
                                iVar54 = iVar54 + 1;
                              } while (iVar54 < m_1.w);
                            }
                            if (0 < (int)uVar37) {
                              lVar57 = -0x20;
                              do {
                                uVar10 = ((undefined8 *)((long)puVar55 + lVar57))[1];
                                *puVar45 = *(undefined8 *)((long)puVar55 + lVar57);
                                puVar45[1] = uVar10;
                                puVar45 = puVar45 + 2;
                                lVar1 = uVar40 * 0x10 + lVar57;
                                lVar57 = lVar57 + -0x10;
                              } while (lVar1 != -0x10);
                            }
                            puVar46 = puVar46 + (long)m_1.w * -2;
                            iVar38 = iVar38 + 1;
                          } while (iVar38 != iVar49);
                        }
                      }
                      piVar8 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                      if (piVar8 != (int *)0x0) {
                        LOCK();
                        *piVar8 = *piVar8 + -1;
                        UNLOCK();
                        if (*piVar8 == 0) {
                          if (m_1.allocator == (Allocator *)0x0) {
                            if (m_1.data != (void *)0x0) {
                              free(m_1.data);
                            }
                          }
                          else {
                            (*(m_1.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      m_1.cstep = 0;
                      m_1.data = (void *)0x0;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = 0;
                      m_1.elemsize._4_4_ = 0;
                      m_1.elempack = 0;
                      m_1.dims = 0;
                      m_1.w = 0;
                      m_1.h = 0;
                      m_1.d = 0;
                      m_1.c = 0;
                    }
                    piVar8 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar8 != (int *)0x0) {
                      LOCK();
                      *piVar8 = *piVar8 + -1;
                      UNLOCK();
                      if (*piVar8 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          if (m.data != (void *)0x0) {
                            free(m.data);
                          }
                        }
                        else {
                          (*(m.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    in_XMM1_Db = 0;
                    in_XMM1_Da = 0;
                    m.cstep = 0;
                    m.data = (void *)0x0;
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = 0;
                    m.elemsize._4_4_ = 0;
                    m.elempack = 0;
                    m.dims = 0;
                    m.w = 0;
                    m.h = 0;
                    m.d = 0;
                    m.c = 0;
                    uVar53 = uVar53 + 1;
                  } while (uVar53 != (uVar58 & 0xffffffff));
                }
                bVar9 = false;
                unaff_EBP = 0;
              }
            }
          }
        }
        if (!bVar9) {
          return unaff_EBP;
        }
      }
      if (iVar5 == 4) {
        p_Var6 = this->_vptr_Padding_x86[-3];
        iVar5 = *(int *)(&this->field_0xe0 + (long)p_Var6);
        if (iVar5 == 0) {
          uVar36 = *(int *)(&this->field_0xe8 + (long)p_Var6) + iVar4 +
                   *(int *)(&this->field_0xec + (long)p_Var6);
          Mat::create(top_blob,iVar2 + *(int *)(&this->field_0xd8 + (long)p_Var6) +
                               *(int *)(&this->field_0xdc + (long)p_Var6),
                      iVar3 + *(int *)(&this->field_0xd0 + (long)p_Var6) +
                      *(int *)(&this->field_0xd4 + (long)p_Var6),uVar36,_c,uVar43,4,
                      opt->blob_allocator);
          unaff_EBP = -100;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            if ((int)_c < 1) {
              unaff_EBP = 0;
            }
            else {
              uVar43 = 0;
              do {
                p_Var6 = this->_vptr_Padding_x86[-3];
                if (*(int *)(&this->field_0xf0 + (long)p_Var6) == 0) {
                  uVar60 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var6);
                  uVar61 = uVar60;
                  uVar62 = uVar60;
                  uVar63 = uVar60;
                }
                else {
                  puVar42 = (undefined4 *)
                            (*(long *)(&this->field_0xf8 + (long)p_Var6) + uVar43 * 0x10);
                  uVar60 = *puVar42;
                  uVar61 = puVar42[1];
                  uVar62 = puVar42[2];
                  uVar63 = puVar42[3];
                }
                if (0 < (int)uVar36) {
                  uVar58 = 0;
                  do {
                    sVar44 = top_blob->elemsize;
                    m.h = top_blob->h;
                    m.elempack = top_blob->elempack;
                    m.allocator = top_blob->allocator;
                    sVar52 = (long)m.h * (long)top_blob->w;
                    m.data = (void *)((long)top_blob->data +
                                     uVar58 * sVar44 * sVar52 + top_blob->cstep * uVar43 * sVar44);
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = (undefined4)sVar44;
                    m.elemsize._4_4_ = (undefined4)(sVar44 >> 0x20);
                    m.w = top_blob->w;
                    m.dims = 2;
                    m.d = 1;
                    m.c = 1;
                    uVar37 = (int)uVar58 -
                             *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86[-3]);
                    if ((int)uVar37 < 0 || iVar4 <= (int)uVar37) {
                      m.cstep._0_4_ = (int)sVar52;
                      puVar42 = (undefined4 *)m.data;
                      if (0 < (int)m.cstep) {
                        do {
                          *puVar42 = uVar60;
                          puVar42[1] = uVar61;
                          puVar42[2] = uVar62;
                          puVar42[3] = uVar63;
                          m.cstep._0_4_ = (int)m.cstep + -1;
                          puVar42 = puVar42 + 4;
                        } while ((int)m.cstep != 0);
                      }
                    }
                    else {
                      m_1.h = bottom_blob->h;
                      sVar44 = bottom_blob->elemsize;
                      m_1.elempack = bottom_blob->elempack;
                      m_1.allocator = bottom_blob->allocator;
                      m_1.cstep = (long)m_1.h * (long)bottom_blob->w;
                      m_1.data = (void *)((long)bottom_blob->data +
                                         m_1.cstep * sVar44 * (ulong)uVar37 +
                                         bottom_blob->cstep * uVar43 * sVar44);
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = (undefined4)sVar44;
                      m_1.elemsize._4_4_ = (undefined4)(sVar44 >> 0x20);
                      m_1.w = bottom_blob->w;
                      m_1.dims = 2;
                      m_1.d = 1;
                      m_1.c = 1;
                      p_Var6 = this->_vptr_Padding_x86[-3];
                      v_02[1] = (float)uVar61;
                      v_02[0] = (float)uVar60;
                      v_02[3] = (float)in_XMM1_Db;
                      v_02[2] = (float)in_XMM1_Da;
                      m.cstep = sVar52;
                      padding_constant_pack4_sse
                                (&m_1,&m,*(int *)(&this->field_0xd0 + (long)p_Var6),
                                 *(int *)(&this->field_0xd4 + (long)p_Var6),
                                 *(int *)(&this->field_0xd8 + (long)p_Var6),
                                 *(int *)(&this->field_0xdc + (long)p_Var6),v_02);
                      piVar8 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                      if (piVar8 != (int *)0x0) {
                        LOCK();
                        *piVar8 = *piVar8 + -1;
                        UNLOCK();
                        if (*piVar8 == 0) {
                          if (m_1.allocator == (Allocator *)0x0) {
                            if (m_1.data != (void *)0x0) {
                              free(m_1.data);
                            }
                          }
                          else {
                            (*(m_1.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      m_1.cstep = 0;
                      m_1.data = (void *)0x0;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = 0;
                      m_1.elemsize._4_4_ = 0;
                      m_1.elempack = 0;
                      m_1.dims = 0;
                      m_1.w = 0;
                      m_1.h = 0;
                      m_1.d = 0;
                      m_1.c = 0;
                      sVar52 = m.cstep;
                    }
                    m.cstep = sVar52;
                    piVar8 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar8 != (int *)0x0) {
                      LOCK();
                      *piVar8 = *piVar8 + -1;
                      UNLOCK();
                      if (*piVar8 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          if (m.data != (void *)0x0) {
                            free(m.data);
                          }
                        }
                        else {
                          (*(m.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    in_XMM1_Da = 0;
                    in_XMM1_Db = 0;
                    uVar58 = uVar58 + 1;
                  } while (uVar58 != uVar36);
                }
                uVar43 = uVar43 + 1;
              } while (uVar43 != _c);
              unaff_EBP = 0;
            }
          }
        }
        if (iVar5 == 0) {
          return unaff_EBP;
        }
      }
    }
    m.data = bottom_blob->data;
    piVar8 = bottom_blob->refcount;
    m.refcount._0_4_ = SUB84(piVar8,0);
    m.refcount._4_4_ = (undefined4)((ulong)piVar8 >> 0x20);
    m.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
    m.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
    m.elempack = bottom_blob->elempack;
    m.allocator = bottom_blob->allocator;
    m.dims = bottom_blob->dims;
    m.w = bottom_blob->w;
    uVar11 = bottom_blob->h;
    uVar12 = bottom_blob->d;
    m.c = bottom_blob->c;
    m.cstep = bottom_blob->cstep;
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + 1;
      UNLOCK();
    }
    m.h = uVar11;
    m.d = uVar12;
    if (iVar35 != 1) {
      m_1.data = *(void **)opt;
      uVar13 = opt->openmp_blocktime;
      uVar14 = opt->use_winograd_convolution;
      uVar16 = opt->use_sgemm_convolution;
      uVar18 = opt->use_int8_inference;
      uVar20 = opt->use_vulkan_compute;
      uVar19 = CONCAT11(uVar20,uVar18);
      uVar17 = CONCAT21(uVar19,uVar16);
      uVar15 = CONCAT31(uVar17,uVar14);
      m_1.allocator = *(Allocator **)&opt->use_bf16_storage;
      m_1._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
      uVar21 = opt->flush_denormals;
      uVar22 = opt->use_local_pool_allocator;
      uVar24 = opt->use_shader_local_memory;
      uVar26 = opt->use_cooperative_matrix;
      uVar28 = opt->use_winograd23_convolution;
      uVar27 = CONCAT11(uVar28,uVar26);
      uVar25 = CONCAT21(uVar27,uVar24);
      uVar23 = CONCAT31(uVar25,uVar22);
      uVar10._0_1_ = opt->use_winograd43_convolution;
      uVar10._1_1_ = opt->use_winograd63_convolution;
      uVar10._2_1_ = opt->use_reserved_6;
      uVar10._3_1_ = opt->use_reserved_7;
      uVar29 = opt->use_reserved_8;
      uVar30 = opt->use_reserved_9;
      uVar32 = opt->use_reserved_10;
      uVar34 = opt->use_reserved_11;
      uVar33 = CONCAT11(uVar34,uVar32);
      uVar31 = CONCAT21(uVar33,uVar30);
      uVar10._4_4_ = CONCAT31(uVar31,uVar29);
      m_1.c = (int)uVar10;
      m_1.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
      m_1.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      m_1.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
      m_1.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      m_1.elempack = uVar13;
      m_1._28_4_ = uVar15;
      m_1.h = uVar21;
      m_1.d = uVar23;
      m_1._60_4_ = uVar10._4_4_;
      convert_packing(bottom_blob,&m,1,(Option *)&m_1);
    }
    iVar35 = Padding::forward((Padding *)
                              ((long)&this->_vptr_Padding_x86 + (long)this->_vptr_Padding_x86[-3]),
                              &m,top_blob,opt);
    piVar8 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar35;
}

Assistant:

int Padding_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 16 == 0 ? 16 : outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, 0, 0, left / 16, right / 16, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, top / 16, bottom / 16, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 16 == 0 && out_elempack == 16 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack16_avx512(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack16_avx512(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}